

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  uint32_t in_R9D;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  rplidar_response_measurement_node_hq_t arStack_7108 [359];
  undefined8 uStack_65d0;
  rplidar_response_measurement_node_hq_t local_65c8;
  rplidar_response_measurement_node_hq_t nodes [2880];
  LaserScan scan;
  rplidar_response_device_info_t devinfo;
  timeval tv;
  size_t count;
  RPlidarDriver *local_38;
  
  uStack_65d0 = 0x104af2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"progress begins ...",0x13);
  uStack_65d0 = 0x104b06;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  uStack_65d0 = 0x104b11;
  std::ostream::put('h');
  uStack_65d0 = 0x104b19;
  std::ostream::flush();
  uStack_65d0 = 0x104b20;
  local_38 = (RPlidarDriver *)rp::standalone::rplidar::RPlidarDriver::CreateDriver(0);
  if (local_38 == (RPlidarDriver *)0x0) {
    uStack_65d0 = 0x104ed0;
    main_cold_1();
    return 0;
  }
  uStack_65d0 = 0x104b44;
  iVar1 = (*(code *)**(undefined8 **)local_38)(local_38,"/dev/ttyUSB1",0x1c200,0);
  if (iVar1 < 0) {
    pcVar7 = "connected failed ...";
    lVar4 = 0x14;
  }
  else {
    uStack_65d0 = 0x104b5b;
    iVar1 = (**(code **)(*(long *)local_38 + 0x50))(local_38,scan.intensities + 0x166,2000);
    if (iVar1 < 0) {
      uStack_65d0 = 0x104bbe;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"get device information failed",0x1d);
      uStack_65d0 = 0x104bd2;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      uStack_65d0 = 0x104bdd;
      std::ostream::put('h');
      uStack_65d0 = 0x104be5;
      std::ostream::flush();
      uStack_65d0 = 0x104bf2;
      (**(code **)(*(long *)local_38 + 0xe0))();
      local_38 = (RPlidarDriver *)0x0;
      goto LAB_00104bfa;
    }
    pcVar7 = "connected successfully ...";
    lVar4 = 0x1a;
  }
  uStack_65d0 = 0x104b81;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar4);
  uStack_65d0 = 0x104b95;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  uStack_65d0 = 0x104ba0;
  std::ostream::put('h');
  uStack_65d0 = 0x104ba8;
  std::ostream::flush();
LAB_00104bfa:
  uStack_65d0 = 0x104c07;
  (**(code **)(*(long *)local_38 + 0x68))(local_38);
  count = 0;
  uStack_65d0 = 0x104c24;
  (**(code **)(*(long *)local_38 + 0x38))(local_38,0,1,0);
  lVar4 = 0;
  do {
    tv.tv_usec = 0xb40;
    uStack_65d0 = 0x104c4f;
    iVar1 = (**(code **)(*(long *)local_38 + 0xb0))(local_38,&local_65c8,&tv.tv_usec,2000);
    cVar5 = ctrl_c_pressed;
    if (iVar1 == 0) {
      if ((int)count == 0) {
        uStack_65d0 = 0x104d2c;
        gettimeofday((timeval *)(devinfo.serialnum + 8),(__timezone_ptr_t)0x0);
        count = 1;
        lVar4 = tv.tv_sec / 1000 + devinfo.serialnum._8_8_ * 1000;
        cVar5 = '\0';
      }
      else {
        count = (size_t)((int)count + 1);
        uStack_65d0 = 0x104c78;
        gettimeofday((timeval *)(devinfo.serialnum + 8),(__timezone_ptr_t)0x0);
        lVar3 = devinfo.serialnum._8_8_ * 1000;
        lVar8 = tv.tv_sec / 1000 + lVar3;
        lVar9 = lVar8 - lVar4;
        uStack_65d0 = 0x104cc6;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"delta_time = ",0xd);
        uStack_65d0 = 0x104cd1;
        poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
        uStack_65d0 = 0x104ce8;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        uStack_65d0 = 0x104cf3;
        std::ostream::put((char)poVar2);
        uStack_65d0 = 0x104cfb;
        std::ostream::flush();
        uStack_65d0 = 0x104d0f;
        iVar1 = (**(code **)(*(long *)local_38 + 0xc0))(local_38,&local_65c8,tv.tv_usec);
        lVar4 = lVar8;
        cVar5 = ctrl_c_pressed;
        if (iVar1 == 0) {
          uStack_65d0 = 0x104d78;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"in here ...",0xb);
          uStack_65d0 = 0x104d8c;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
          uStack_65d0 = 0x104d97;
          std::ostream::put('h');
          uStack_65d0 = 0x104d9f;
          std::ostream::flush();
          memset(arStack_7108,0,0xb40);
          if (tv.tv_usec != 0) {
            lVar3 = 0;
            iVar1 = 0;
            do {
              if (nodes[lVar3 + -1].dist_mm_q2 != 0) {
                fVar11 = (float)nodes[lVar3 + -1].angle_z_q14 * 90.0 * 6.1035156e-05;
                fVar10 = (float)(int)fVar11;
                if (fVar10 < (float)iVar1) {
                  iVar1 = (int)fVar11;
                }
                iVar6 = (int)(fVar10 - (float)iVar1);
                if (0x166 < iVar6) {
                  iVar6 = 0x167;
                }
                arStack_7108[iVar6] = nodes[lVar3 + -1];
              }
              lVar3 = lVar3 + 1;
            } while (tv.tv_usec != lVar3);
          }
          publish_scan(arStack_7108,(LaserScan *)(nodes + 0xb3f),0x168,(uint32_t)lVar3,
                       (double)lVar9 * 0.001,false,0.0,6.265732,8.0,in_R9D);
          cVar5 = ctrl_c_pressed;
        }
      }
    }
  } while (cVar5 == '\0');
  uStack_65d0 = 0x104ea9;
  (**(code **)(*(long *)local_38 + 0xa0))(local_38,2000);
  uStack_65d0 = 0x104eb2;
  (**(code **)(*(long *)local_38 + 0x70))(local_38);
  uStack_65d0 = 0x104eba;
  rp::standalone::rplidar::RPlidarDriver::DisposeDriver(local_38);
  return 0;
}

Assistant:

int main()
{
	std::cout<<"progress begins ..."<<std::endl;

	slam::sensor::LaserScan scan;

	long previous_time = 0;
	long current_time = 0;
	long delta_time = 0;

	const char * opt_com_path = "/dev/ttyUSB1";
	_u32 opt_com_baudrate = 115200;
	u_result op_result;
	
	bool angle_compensate = true;
	int angle_compensate_multiple = 1;
	bool inverted = false;	

	// create the driver instance
        RPlidarDriver * drv = RPlidarDriver::CreateDriver(DRIVER_TYPE_SERIALPORT);

	if (!drv) {
        	fprintf(stderr, "insufficent memory, exit\n");
        	return false;
    	}
	
	rplidar_response_device_info_t devinfo;
	if (IS_OK(drv->connect(opt_com_path, opt_com_baudrate)))
        {
            op_result = drv->getDeviceInfo(devinfo);

            if (IS_OK(op_result))
            {   
              	std::cout<<"connected successfully ..."<<std::endl;
            }
            else
            {
		std::cout<<"get device information failed"<<std::endl;
                delete drv;
                drv = NULL;
            }
        }
	else{
		std::cout<<"connected failed ..."<<std::endl;
	}

	drv->startMotor();
	drv->startScan( 0, 1 );
	
	uint32_t scan_num  = 0;
	while(1){
		rplidar_response_measurement_node_hq_t nodes[360 * 8];
		size_t   count = _countof(nodes);
		op_result = drv->grabScanDataHq( nodes, count );
		
		if( op_result == RESULT_OK ){
			scan_num ++;
			if( scan_num == 1 ){
				current_time = previous_time = getCurrentTime_ms();
				continue;
			}
			current_time = getCurrentTime_ms();
			delta_time = current_time - previous_time;
			std::cout<<"delta_time = "<<delta_time<<std::endl;
			op_result = drv->ascendScanData( nodes, count );
			float angle_min = DEG2RAD( 0.0f );
			float angle_max = DEG2RAD( 359.0f );
			if( op_result == RESULT_OK ){
				if( angle_compensate ){
					std::cout<<"in here ..."<<std::endl;
					const int angle_compensate_nodes_count = 360 * angle_compensate_multiple;
					int angle_compensate_offset = 0;
					rplidar_response_measurement_node_hq_t angle_compensate_nodes[ angle_compensate_nodes_count ];
					memset( angle_compensate_nodes, 0, angle_compensate_nodes_count * sizeof( rplidar_response_measurement_node_hq_t ) );
					
					for( int i = 0; i < count; i ++ ){
						if( nodes[i].dist_mm_q2 != 0 ){
							float angle = getAngle( nodes[i] );
							float angle_value = (int)( angle * angle_compensate_multiple );
							if( ( angle_value - angle_compensate_offset ) < 0 ) angle_compensate_offset = angle_value;
							for( int j = 0; j < angle_compensate_multiple; j ++ ){
								int angle_compensate_nodes_index = angle_value - angle_compensate_offset + j ;
								if( angle_compensate_nodes_index >= angle_compensate_nodes_count )
									angle_compensate_nodes_index = angle_compensate_nodes_count - 1 ;
								angle_compensate_nodes[angle_compensate_nodes_index] = nodes[i];
							}
						}
					}
					
					publish_scan( angle_compensate_nodes, scan, angle_compensate_nodes_count, \
						        current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
				else{
					int start_node = 0, end_node = 0;
					int i = 0;	
					while( nodes[i++].dist_mm_q2 == 0 );
					start_node = i - 1;
					i = count - 1;
					while( nodes[i--].dist_mm_q2 == 0 );
					end_node = i + 1;

					angle_min = DEG2RAD( getAngle( nodes[start_node] ) );
					angle_max = DEG2RAD( getAngle( nodes[end_node] ) );

					publish_scan( nodes, scan, count, current_time, ( double )( delta_time * 0.001 ), inverted, angle_min, angle_max, 8.0, scan_num );
				}
			}
			else if( op_result == RESULT_OPERATION_FAIL ){
				float angle_min = DEG2RAD( 0.0f );
				float angle_max = DEG2RAD( 359.0f );
				//publish_scan(  );
			}

			previous_time = current_time;
		}
		
		if( ctrl_c_pressed ){
			break;
		}
        }
	
	drv->stop();
	drv->stopMotor();
	RPlidarDriver::DisposeDriver(drv);
    	drv = NULL;

	
	return 0;
}